

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall
llbuild::core::TaskInterface::request(TaskInterface *this,KeyType *key,uintptr_t inputID)

{
  Task *task;
  uintptr_t inputID_local;
  KeyType *key_local;
  TaskInterface *this_local;
  
  anon_unknown.dwarf_fc19c::BuildEngineImpl::taskNeedsInput
            ((BuildEngineImpl *)this->impl,(Task *)this->ctx,key,inputID);
  return;
}

Assistant:

void TaskInterface::request(const KeyType& key, uintptr_t inputID) {
  Task* task = static_cast<Task*>(ctx);
  static_cast<BuildEngineImpl*>(impl)->taskNeedsInput(task, key, inputID);
}